

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::ccoins_access::test_method(ccoins_access *this)

{
  undefined8 in_RDI;
  long in_FS_OFFSET;
  CAmount unaff_retaddr;
  char in_stack_000000bf;
  CAmount in_stack_000000c0;
  char cache_flags;
  CAmount cache_value;
  
  cache_flags = (char)((ulong)in_RDI >> 0x38);
  cache_value = *(CAmount *)(in_FS_OFFSET + 0x28);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  CheckAccessCoin(unaff_retaddr,cache_value,in_stack_000000c0,cache_flags,in_stack_000000bf);
  if (*(long *)(in_FS_OFFSET + 0x28) == cache_value) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_access)
{
    /* Check AccessCoin behavior, requesting a coin from a cache view layered on
     * top of a base view, and checking the resulting entry in the cache after
     * the access.
     *
     *               Base    Cache   Result  Cache        Result
     *               Value   Value   Value   Flags        Flags
     */
    CheckAccessCoin(ABSENT, ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckAccessCoin(ABSENT, SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(ABSENT, SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(ABSENT, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(ABSENT, SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(ABSENT, VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(SPENT , ABSENT, ABSENT, NO_ENTRY   , NO_ENTRY   );
    CheckAccessCoin(SPENT , SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(SPENT , SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(SPENT , SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(SPENT , SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(SPENT , VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(SPENT , VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(VALUE1, ABSENT, VALUE1, NO_ENTRY   , 0          );
    CheckAccessCoin(VALUE1, SPENT , SPENT , 0          , 0          );
    CheckAccessCoin(VALUE1, SPENT , SPENT , FRESH      , FRESH      );
    CheckAccessCoin(VALUE1, SPENT , SPENT , DIRTY      , DIRTY      );
    CheckAccessCoin(VALUE1, SPENT , SPENT , DIRTY|FRESH, DIRTY|FRESH);
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, 0          , 0          );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, FRESH      , FRESH      );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, DIRTY      , DIRTY      );
    CheckAccessCoin(VALUE1, VALUE2, VALUE2, DIRTY|FRESH, DIRTY|FRESH);
}